

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O0

RawTransactionResponseStruct *
cfd::js::api::TransactionStructApi::UpdateTxInSequence
          (RawTransactionResponseStruct *__return_storage_ptr__,
          UpdateTxInSequenceRequestStruct *request)

{
  UpdateTxInSequenceRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxInSequenceRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  UpdateTxInSequenceRequestStruct *pUStack_18;
  anon_class_1_0_00000001 call_func;
  UpdateTxInSequenceRequestStruct *request_local;
  RawTransactionResponseStruct *result;
  
  local_1a = 0;
  pUStack_18 = request;
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  this = pUStack_18;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxInSequenceRequestStruct_const&)>
  ::
  function<cfd::js::api::TransactionStructApi::UpdateTxInSequence(cfd::js::api::UpdateTxInSequenceRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxInSequenceRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"UpdateTxInSequence",&local_129);
  ExecuteStructApi<cfd::js::api::UpdateTxInSequenceRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)(local_108 + 0x20),(api *)this,
             (UpdateTxInSequenceRequestStruct *)local_108,&local_128,in_R8);
  RawTransactionResponseStruct::operator=
            (__return_storage_ptr__,(RawTransactionResponseStruct *)(local_108 + 0x20));
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxInSequenceRequestStruct_&)>
  ::~function((function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxInSequenceRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct TransactionStructApi::UpdateTxInSequence(
    const UpdateTxInSequenceRequestStruct& request) {
  auto call_func = [](const UpdateTxInSequenceRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    TransactionContext txc(request.tx);
    auto index = txc.GetTxInIndex(Txid(request.txid), request.vout);
    txc.SetTxInSequence(index, request.sequence);

    response.hex = txc.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      UpdateTxInSequenceRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}